

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O3

void __thiscall Imf_3_2::Image::clearChannels(Image *this)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  lVar4 = (this->_levels)._sizeX;
  if (0 < lVar4) {
    lVar2 = (this->_levels)._sizeY;
    lVar5 = 0;
    lVar6 = 0;
    lVar3 = lVar2;
    do {
      if (0 < lVar3) {
        lVar4 = 0;
        do {
          plVar1 = *(long **)((long)(this->_levels)._data + lVar4 * 8 + lVar3 * lVar5);
          if (plVar1 != (long *)0x0) {
            (**(code **)(*plVar1 + 0x30))();
            lVar2 = (this->_levels)._sizeY;
          }
          lVar4 = lVar4 + 1;
          lVar3 = lVar2;
        } while (lVar4 < lVar2);
        lVar4 = (this->_levels)._sizeX;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 8;
    } while (lVar6 < lVar4);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
  ::clear(&(this->_channels)._M_t);
  return;
}

Assistant:

void
Image::clearChannels ()
{
    for (int y = 0; y < _levels.height (); ++y)
        for (int x = 0; x < _levels.width (); ++x)
            if (_levels[y][x]) _levels[y][x]->clearChannels ();

    _channels.clear ();
}